

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdatawidgetmapper.cpp
# Opt level: O3

void __thiscall QDataWidgetMapper::removeMapping(QDataWidgetMapper *this,QWidget *widget)

{
  long lVar1;
  long lVar2;
  long lVar3;
  int iVar4;
  long lVar5;
  QWidget *pQVar6;
  
  lVar2 = *(long *)(this + 8);
  lVar3 = *(long *)(lVar2 + 0xa0);
  if (lVar3 != *(long *)(lVar2 + 0xa8)) {
    lVar5 = 0;
    do {
      if ((*(long *)(lVar3 + lVar5) == 0) || (*(int *)(*(long *)(lVar3 + lVar5) + 4) == 0)) {
        pQVar6 = (QWidget *)0x0;
      }
      else {
        pQVar6 = *(QWidget **)(lVar3 + 8 + lVar5);
      }
      if (pQVar6 == widget) {
        iVar4 = (int)(lVar5 >> 3) * -0x49249249;
        if (iVar4 == -1) {
          return;
        }
        std::
        vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
        ::_M_erase((vector<QDataWidgetMapperPrivate::WidgetMapper,_std::allocator<QDataWidgetMapperPrivate::WidgetMapper>_>
                    *)(lVar2 + 0xa0),(WidgetMapper *)(lVar3 + (long)iVar4 * 0x38));
        QObject::removeEventFilter(&widget->super_QObject);
        return;
      }
      lVar1 = lVar3 + lVar5;
      lVar5 = lVar5 + 0x38;
    } while (lVar1 + 0x38 != *(long *)(lVar2 + 0xa8));
  }
  return;
}

Assistant:

void QDataWidgetMapper::removeMapping(QWidget *widget)
{
    Q_D(QDataWidgetMapper);

    int idx = d->findWidget(widget);
    if (idx == -1)
        return;

    d->widgetMap.erase(d->widgetMap.begin() + idx);
    widget->removeEventFilter(d->delegate);
}